

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> * __thiscall
tinyusdz::Xformable::xformOpOrder
          (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__return_storage_ptr__,
          Xformable *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *op;
  ulong uVar3;
  pointer pXVar4;
  long lVar5;
  string ss;
  value_type xformOp;
  string local_e8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  undefined4 local_a0;
  char local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [16];
  long local_68;
  undefined1 local_60;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_58;
  char local_40;
  char local_38;
  
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pXVar4 = (this->xformOps).
           super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c8 = __return_storage_ptr__;
  if ((this->xformOps).super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
      _M_impl.super__Vector_impl_data._M_finish != pXVar4) {
    paVar1 = &local_e8.field_2;
    lVar5 = 0x48;
    uVar3 = 0;
    do {
      local_c0 = &local_b0;
      local_b8 = 0;
      local_b0 = 0;
      local_9c = *(char *)((long)pXVar4 + lVar5 + -0x44);
      local_a0 = *(undefined4 *)((long)pXVar4 + lVar5 + -0x48);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      lVar2 = *(long *)((long)pXVar4 + lVar5 + -0x40);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,lVar2,*(long *)((long)pXVar4 + lVar5 + -0x38) + lVar2);
      local_68 = *(long *)((long)pXVar4 + lVar5 + -0x10);
      if (local_68 != 0) {
        (**(code **)(local_68 + 0x28))(lVar5 + -0x20 + (long)pXVar4,local_78);
      }
      local_60 = *(undefined1 *)((long)pXVar4 + lVar5 + -8);
      std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::vector(&local_58,
               (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                *)((long)&pXVar4->op_type + lVar5));
      local_40 = (pXVar4->suffix).field_2._M_local_buf[lVar5];
      local_38 = (pXVar4->suffix).field_2._M_local_buf[lVar5 + 8];
      op = extraout_RDX;
      if (local_9c == '\x01') {
        std::__cxx11::string::append((char *)&local_c0);
        op = extraout_RDX_00;
      }
      tinyusdz::to_string_abi_cxx11_(&local_e8,(tinyusdz *)&local_a0,op);
      std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
      if (local_98._M_string_length != 0) {
        std::operator+(&local_e8,":",&local_98);
        std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
      }
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_assign((string *)&local_e8);
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::emplace_back<tinyusdz::Token>
                (local_c8,(Token *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector(&local_58);
      if (local_68 != 0) {
        (**(code **)(local_68 + 0x20))(local_78);
        local_68 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
      }
      uVar3 = uVar3 + 1;
      pXVar4 = (this->xformOps).
               super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x70;
    } while (uVar3 < (ulong)(((long)(this->xformOps).
                                    super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pXVar4 >> 4)
                            * 0x6db6db6db6db6db7));
  }
  return local_c8;
}

Assistant:

bool is_identity(const value::matrix4d &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[0][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][1], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[1][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][2], 1.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[2][3], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][0], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][1], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][2], 0.0, uint64_t(kIdentityMaxUlps)) &&
         math::almost_equals_by_ulps(m.m[3][3], 1.0, uint64_t(kIdentityMaxUlps));
}